

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

LabeledDataset * __thiscall
notch::core::LabeledDataset::append(LabeledDataset *this,Input *input,Output *output)

{
  if (this->nSamples == 0) {
    this->inputDimension = input->_M_size;
    this->outputDimension = output->_M_size;
  }
  else {
    if (this->inputDimension != input->_M_size) {
      __assert_fail("inputDimension == input.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xed,"LabeledDataset &notch::LabeledDataset::append(Input &, Output &)");
    }
    if (this->outputDimension != output->_M_size) {
      __assert_fail("outputDimension == output.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                    ,0xee,"LabeledDataset &notch::LabeledDataset::append(Input &, Output &)");
    }
  }
  this->nSamples = this->nSamples + 1;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->inputs,input);
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::push_back
            (&this->outputs,output);
  return this;
}

Assistant:

LabeledDataset &append(Input &input, Output &output) {
        if (nSamples != 0) {
            assert(inputDimension == input.size());
            assert(outputDimension == output.size());
        } else {
            inputDimension = input.size();
            outputDimension = output.size();
        }
        nSamples++;
        inputs.push_back(input);
        outputs.push_back(output);
        return *this;
    }